

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O2

Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::flagFromValue_abi_cxx11_
          (Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,renderdesc *this,Value *v)

{
  bool bVar1;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ExpectedRef<const_std::string,_std::string> s_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  ExpectedRef<const_std::string,_std::string> local_40;
  
  yaml::Value::getString_abi_cxx11_(&local_40,(Value *)this);
  if (local_40.has_value_ == false) {
    pbVar3 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&local_40);
    std::operator+(&local_80,"Cannot read Flag: ",pbVar3);
LAB_001200e0:
    local_60 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_50._8_8_ = local_80.field_2._8_8_;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_80._M_dataplus._M_p;
    }
    local_58 = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    prVar2 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&local_40);
    pbVar3 = prVar2->_M_data;
    bVar1 = std::operator==(pbVar3,"DepthTest");
    if (bVar1) {
      (__return_storage_ptr__->field_0).value_ = DepthTest;
    }
    else {
      bVar1 = std::operator==(pbVar3,"VertexProgramPointSize");
      if (!bVar1) {
        format_abi_cxx11_(&local_80,"Unknown flag %s",(pbVar3->_M_dataplus)._M_p);
        goto LAB_001200e0;
      }
      (__return_storage_ptr__->field_0).value_ = VertexProgramPointSize;
    }
    __return_storage_ptr__->has_value_ = true;
  }
  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static Expected<Command::Flag, std::string> flagFromValue(const yaml::Value &v) {
	auto s_result = v.getString();
	if (!s_result)
		return Unexpected("Cannot read Flag: " + s_result.error());

	const std::string &s = s_result.value();
	if (s == "DepthTest") return Command::Flag::DepthTest;
#ifndef ATTO_PLATFORM_RPI
	if (s == "VertexProgramPointSize") return Command::Flag::VertexProgramPointSize;
#endif

	return Unexpected(format("Unknown flag %s", s.c_str()));
}